

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  Vector<tcu::Interval,_3> *pVVar5;
  IVal *pIVar6;
  long lVar7;
  byte bVar8;
  undefined8 uStack_80;
  IVal local_78;
  
  bVar8 = 0;
  uStack_80 = 0x9054d1;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  bVar2 = false;
  lVar7 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    if (bVar2) {
      uStack_80 = 0x9054fb;
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    lVar3 = 8;
    do {
      *(undefined1 *)((long)local_78.m_data + lVar3 + -8) = 0;
      *(undefined4 *)(&local_78.m_data[0].m_hasNaN + lVar3) = 0;
      *(undefined4 *)(&local_78.m_data[0].field_0x4 + lVar3) = 0x7ff00000;
      *(undefined4 *)((long)&local_78.m_data[0].m_lo + lVar3) = 0;
      *(undefined4 *)((long)&local_78.m_data[0].m_lo + lVar3 + 4) = 0xfff00000;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x50);
    pVVar5 = (ival->m_data).m_data + lVar7;
    pIVar6 = &local_78;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)pIVar6 = *(undefined8 *)pVVar5->m_data;
      pVVar5 = (Vector<tcu::Interval,_3> *)((long)pVVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      pIVar6 = (IVal *)((long)pIVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    uStack_80 = 0x90553b;
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doPrintIVal
              (fmt,&local_78,os);
    lVar7 = 1;
    bVar2 = true;
    bVar1 = false;
  } while (bVar4);
  uStack_80 = 0x905569;
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}